

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O3

void decimate(double *x,int x_length,int r,double *y)

{
  long lVar1;
  double dVar2;
  uint x_length_00;
  int iVar3;
  double *x_00;
  double *y_00;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  x_length_00 = x_length + 0x12;
  uVar8 = (ulong)x_length_00;
  uVar5 = 0xffffffffffffffff;
  if (-0x13 < x_length) {
    uVar5 = uVar8 * 8;
  }
  x_00 = (double *)operator_new__(uVar5);
  y_00 = (double *)operator_new__(uVar5);
  dVar2 = *x;
  lVar4 = 0x48;
  pdVar6 = x_00;
  do {
    *pdVar6 = (dVar2 + dVar2) - *(double *)((long)x + lVar4);
    pdVar6 = pdVar6 + 1;
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0);
  iVar9 = x_length + 9;
  if (0 < x_length) {
    iVar3 = 10;
    if (10 < iVar9) {
      iVar3 = iVar9;
    }
    memcpy(x_00 + 9,x,(ulong)(iVar3 - 9) << 3);
  }
  dVar2 = x[(long)x_length + -1];
  iVar3 = x_length + -2;
  lVar4 = (long)iVar9;
  do {
    x_00[lVar4] = (dVar2 + dVar2) - x[iVar3];
    lVar4 = lVar4 + 1;
    iVar3 = iVar3 + -1;
  } while (lVar4 < (int)x_length_00);
  anon_unknown.dwarf_7051::FilterForDecimate(x_00,x_length_00,r,y_00);
  if (x_length < -0x11) {
    anon_unknown.dwarf_7051::FilterForDecimate(x_00,x_length_00,r,y_00);
  }
  else {
    uVar5 = 1;
    if (1 < (int)x_length_00) {
      uVar5 = uVar8;
    }
    iVar3 = x_length + 0x11;
    uVar7 = 0;
    do {
      x_00[uVar7] = y_00[iVar3];
      uVar7 = uVar7 + 1;
      iVar3 = iVar3 + -1;
    } while (uVar5 != uVar7);
    anon_unknown.dwarf_7051::FilterForDecimate(x_00,x_length_00,r,y_00);
    if (-0x12 < x_length) {
      uVar5 = 1;
      if (1 < (int)x_length_00) {
        uVar5 = uVar8;
      }
      iVar3 = x_length + 0x11;
      uVar8 = 0;
      do {
        x_00[uVar8] = y_00[iVar3];
        uVar8 = uVar8 + 1;
        iVar3 = iVar3 + -1;
      } while (uVar5 != uVar8);
    }
  }
  iVar3 = (x_length + -1) % r;
  if (iVar3 + 1 < iVar9) {
    lVar4 = (long)iVar3 + 9;
    do {
      *y = x_00[lVar4];
      y = y + 1;
      lVar1 = lVar4 + r;
      lVar4 = lVar4 + r;
    } while (lVar1 + -8 < (long)iVar9);
  }
  operator_delete__(x_00);
  operator_delete__(y_00);
  return;
}

Assistant:

void decimate(const double *x, int x_length, int r, double *y) {
  const int kNFact = 9;
  double *tmp1 = new double[x_length + kNFact * 2];
  double *tmp2 = new double[x_length + kNFact * 2];

  for (int i = 0; i < kNFact; ++i) tmp1[i] = 2 * x[0] - x[kNFact - i];
  for (int i = kNFact; i < kNFact + x_length; ++i) tmp1[i] = x[i - kNFact];
  for (int i = kNFact + x_length; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = 2 * x[x_length - 1] - x[x_length - 2 - (i - (kNFact + x_length))];

  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];
  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];

  int nout = (x_length - 1) / r + 1;
  int nbeg = r - r * nout + x_length;

  int count = 0;
  for (int i = nbeg; i < x_length + kNFact; i += r)
    y[count++] = tmp1[i + kNFact - 1];

  delete[] tmp1;
  delete[] tmp2;
}